

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O0

Cec_ManPat_t * Cec_ManPatStart(void)

{
  Cec_ManPat_t *pCVar1;
  Vec_Str_t *pVVar2;
  Vec_Int_t *pVVar3;
  Cec_ManPat_t *p;
  
  pCVar1 = (Cec_ManPat_t *)calloc(1,0x78);
  pVVar2 = Vec_StrAlloc(0x100000);
  pCVar1->vStorage = pVVar2;
  pVVar3 = Vec_IntAlloc(1000);
  pCVar1->vPattern1 = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pCVar1->vPattern2 = pVVar3;
  return pCVar1;
}

Assistant:

Cec_ManPat_t * Cec_ManPatStart()  
{ 
    Cec_ManPat_t * p;
    p = ABC_CALLOC( Cec_ManPat_t, 1 );
    p->vStorage  = Vec_StrAlloc( 1<<20 );
    p->vPattern1 = Vec_IntAlloc( 1000 );
    p->vPattern2 = Vec_IntAlloc( 1000 );
    return p;
}